

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::DescriptorProto_ReservedRange::_InternalParse
          (DescriptorProto_ReservedRange *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  void *pvVar2;
  bool bVar3;
  UnknownFieldSet *unknown;
  byte *p;
  uint uVar4;
  uint uVar5;
  pair<const_char_*,_unsigned_int> pVar6;
  pair<const_char_*,_unsigned_long> pVar7;
  byte *local_38;
  char *ptr_local;
  
  local_38 = (byte *)ptr;
  bVar3 = internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
  uVar5 = 0;
  if (!bVar3) {
    this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
    uVar5 = 0;
    do {
      bVar1 = *local_38;
      uVar4 = (uint)bVar1;
      p = local_38 + 1;
      if ((char)bVar1 < '\0') {
        uVar4 = ((uint)bVar1 + (uint)*p * 0x80) - 0x80;
        if (-1 < (char)*p) {
          p = local_38 + 2;
          goto LAB_00294b6e;
        }
        pVar6 = internal::ReadTagFallback((char *)local_38,uVar4);
        p = (byte *)pVar6.first;
        if (p != (byte *)0x0) {
          uVar4 = pVar6.second;
          goto LAB_00294b6e;
        }
LAB_00294cad:
        local_38 = (byte *)0x0;
        break;
      }
LAB_00294b6e:
      local_38 = p;
      if (uVar4 >> 3 == 2) {
        if ((char)uVar4 != '\x10') goto LAB_00294bf4;
        uVar5 = uVar5 | 2;
        bVar1 = *p;
        uVar4 = (uint)bVar1;
        local_38 = p + 1;
        if ((char)bVar1 < '\0') {
          uVar4 = ((uint)bVar1 + (uint)*local_38 * 0x80) - 0x80;
          if ((char)*local_38 < '\0') {
            local_38 = p;
            pVar7 = internal::VarintParseSlow64((char *)p,uVar4);
            local_38 = (byte *)pVar7.first;
            this->end_ = (int32)pVar7.second;
            goto LAB_00294c33;
          }
          local_38 = p + 2;
        }
        this->end_ = uVar4;
      }
      else if ((uVar4 >> 3 == 1) && ((char)uVar4 == '\b')) {
        uVar5 = uVar5 | 1;
        bVar1 = *p;
        uVar4 = (uint)bVar1;
        local_38 = p + 1;
        if ((char)bVar1 < '\0') {
          uVar4 = ((uint)bVar1 + (uint)*local_38 * 0x80) - 0x80;
          if ((char)*local_38 < '\0') {
            local_38 = p;
            pVar7 = internal::VarintParseSlow64((char *)p,uVar4);
            local_38 = (byte *)pVar7.first;
            this->start_ = (int32)pVar7.second;
            goto LAB_00294c33;
          }
          local_38 = p + 2;
        }
        this->start_ = uVar4;
      }
      else {
LAB_00294bf4:
        if ((uVar4 == 0) || ((uVar4 & 7) == 4)) {
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar4 - 1;
          break;
        }
        pvVar2 = this_00->ptr_;
        if (((ulong)pvVar2 & 1) == 0) {
          unknown = internal::InternalMetadata::
                    mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
        }
        else {
          unknown = (UnknownFieldSet *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 8);
        }
        local_38 = (byte *)internal::UnknownFieldParse((ulong)uVar4,unknown,(char *)local_38,ctx);
LAB_00294c33:
        if (local_38 == (byte *)0x0) goto LAB_00294cad;
      }
      bVar3 = internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    } while (!bVar3);
  }
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar5;
  return (char *)local_38;
}

Assistant:

const char* DescriptorProto_ReservedRange::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional int32 start = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8)) {
          _Internal::set_has_start(&has_bits);
          start_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional int32 end = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          _Internal::set_has_end(&has_bits);
          end_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}